

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<std::array<void(*)(void*,int,unsigned_short_const*,int,int,int,int,int,int,int,int),4ul>,std::array<void(*)(void*,int,unsigned_short_const*,int,int,int,int,int,int,int,int),4ul>,BLOCK_SIZE,int,int>
::IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul,4ul>>::AdvanceIfEnd<3ul>
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL>_> *this)

{
  bool bVar1;
  ParamIterator<BLOCK_SIZE> *this_00;
  size_t NextI;
  bool last;
  ParamIterator<int> *in_stack_ffffffffffffffc8;
  ParamIterator<int> *in_stack_ffffffffffffffd0;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 uVar2;
  
  std::
  get<3ul,testing::internal::ParamIterator<std::array<void(*)(void*,int,unsigned_short_const*,int,int,int,int,int,int,int,int),4ul>>,testing::internal::ParamIterator<std::array<void(*)(void*,int,unsigned_short_const*,int,int,int,int,int,int,int,int),4ul>>,testing::internal::ParamIterator<BLOCK_SIZE>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
            ((tuple<testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
              *)0x40b8dc);
  std::
  get<3ul,testing::internal::ParamIterator<std::array<void(*)(void*,int,unsigned_short_const*,int,int,int,int,int,int,int,int),4ul>>,testing::internal::ParamIterator<std::array<void(*)(void*,int,unsigned_short_const*,int,int,int,int,int,int,int,int),4ul>>,testing::internal::ParamIterator<BLOCK_SIZE>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
            ((tuple<testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
              *)0x40b8ef);
  bVar1 = ParamIterator<int>::operator!=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (!bVar1) {
    uVar2 = 0;
    this_00 = (ParamIterator<BLOCK_SIZE> *)
              std::
              get<3ul,testing::internal::ParamIterator<std::array<void(*)(void*,int,unsigned_short_const*,int,int,int,int,int,int,int,int),4ul>>,testing::internal::ParamIterator<std::array<void(*)(void*,int,unsigned_short_const*,int,int,int,int,int,int,int,int),4ul>>,testing::internal::ParamIterator<BLOCK_SIZE>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
                        ((tuple<testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                          *)0x40b929);
    std::
    get<3ul,testing::internal::ParamIterator<std::array<void(*)(void*,int,unsigned_short_const*,int,int,int,int,int,int,int,int),4ul>>,testing::internal::ParamIterator<std::array<void(*)(void*,int,unsigned_short_const*,int,int,int,int,int,int,int,int),4ul>>,testing::internal::ParamIterator<BLOCK_SIZE>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                *)0x40b93c);
    ParamIterator<int>::operator=((ParamIterator<int> *)this_00,in_stack_ffffffffffffffc8);
    std::
    get<2ul,testing::internal::ParamIterator<std::array<void(*)(void*,int,unsigned_short_const*,int,int,int,int,int,int,int,int),4ul>>,testing::internal::ParamIterator<std::array<void(*)(void*,int,unsigned_short_const*,int,int,int,int,int,int,int,int),4ul>>,testing::internal::ParamIterator<BLOCK_SIZE>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                *)0x40b957);
    ParamIterator<BLOCK_SIZE>::operator++(this_00);
    AdvanceIfEnd<2ul>((IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL>_> *)
                      CONCAT17(uVar2,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void AdvanceIfEnd() {
      if (std::get<ThisI>(current_) != std::get<ThisI>(end_)) return;

      bool last = ThisI == 0;
      if (last) {
        // We are done. Nothing else to propagate.
        return;
      }

      constexpr size_t NextI = ThisI - (ThisI != 0);
      std::get<ThisI>(current_) = std::get<ThisI>(begin_);
      ++std::get<NextI>(current_);
      AdvanceIfEnd<NextI>();
    }